

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phyr_math.h
# Opt level: O0

ostream * phyr::operator<<(ostream *os,Mat4x4 *mat)

{
  ostream *poVar1;
  _Mat4x4 *in_RSI;
  ostream *in_RDI;
  double dVar2;
  int j;
  int i;
  int local_18;
  int local_14;
  
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
      dVar2 = _Mat4x4::operator()(in_RSI,local_14,local_18);
      poVar1 = (ostream *)std::ostream::operator<<(in_RDI,dVar2);
      std::operator<<(poVar1,", ");
    }
    dVar2 = _Mat4x4::operator()(in_RSI,local_14,3);
    std::ostream::operator<<(in_RDI,dVar2);
    if (local_14 < 3) {
      std::operator<<(in_RDI,"\n");
    }
  }
  return in_RDI;
}

Assistant:

inline std::ostream& operator<<(std::ostream& os, const Mat4x4& mat) {
    for (int i = 0; i < 4; i++) {
        for (int j = 0; j < 3; j++)
            os << mat(i, j) << ", ";
        os << mat(i, 3); if (i < 3) os << "\n";
    }

    return os;
}